

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::OP_GetThis(Var thisVar,int moduleID,ScriptContextInfo *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *this;
  Var pvVar5;
  char *message;
  char *error;
  uint lineNumber;
  char *fileName;
  Type typeId;
  
  if (thisVar == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00ab272e;
    *puVar4 = 0;
LAB_00ab25cd:
    this = UnsafeVarTo<Js::RecyclableObject>(thisVar);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00ab272e;
      *puVar4 = 0;
    }
    typeId = ((this->type).ptr)->typeId;
    if ((int)typeId < 0x58) {
      if (0x3a < typeId - TypeIds_HostDispatch) goto LAB_00ab270f;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
      ;
      error = "(!JavascriptOperators::IsThisSelf(typeId))";
      message = "!JavascriptOperators::IsThisSelf(typeId)";
      lineNumber = 0x155e;
    }
    else {
      BVar3 = RecyclableObject::IsExternal(this);
      if (BVar3 != 0) goto LAB_00ab270f;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      fileName = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
      ;
      error = "(typeId < TypeIds_Limit || obj->IsExternal())";
      message = "GetTypeId aValue has invalid TypeId";
      lineNumber = 0xe;
    }
    bVar2 = Throw::ReportAssert(fileName,lineNumber,error,message);
    if (!bVar2) {
LAB_00ab272e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  else {
    if (((ulong)thisVar & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)thisVar & 0xffff000000000000) != 0x1000000000000) {
      typeId = TypeIds_FirstNumberType;
      if ((((ulong)thisVar & 0xffff000000000000) == 0x1000000000000) ||
         (typeId = TypeIds_Number, (ulong)thisVar >> 0x32 != 0)) goto LAB_00ab270f;
      goto LAB_00ab25cd;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00ab272e;
    typeId = TypeIds_FirstNumberType;
  }
  *puVar4 = 0;
LAB_00ab270f:
  pvVar5 = GetThisHelper(thisVar,typeId,moduleID,scriptContext);
  return pvVar5;
}

Assistant:

Var JavascriptOperators::OP_GetThis(Var thisVar, int moduleID, ScriptContextInfo* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(LdThis);
        //
        // if "this" is null or undefined
        //   Pass the global object
        // Else
        //   Pass ToObject(this)
        //
        TypeId typeId = JavascriptOperators::GetTypeId(thisVar);

        Assert(!JavascriptOperators::IsThisSelf(typeId));

        return JavascriptOperators::GetThisHelper(thisVar, typeId, moduleID, scriptContext);
        JIT_HELPER_END(LdThis);
    }